

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::InputIntN(char *label,int *v,int components,ImGuiInputTextFlags extra_flags)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  char *scalar_format;
  ulong uVar9;
  uint uVar10;
  float w_full;
  float fVar11;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if (pIVar2->SkipItems == false) {
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,w_full);
    if (components < 1) {
      bVar7 = false;
    }
    else {
      pcVar8 = "%s: %08X";
      if ((extra_flags & 2U) == 0) {
        pcVar8 = "%s: %d";
      }
      uVar9 = 0;
      bVar7 = false;
      do {
        PushID((int)uVar9);
        bVar6 = InputScalarEx("##v",ImGuiDataType_Int,v,(void *)0x0,(void *)0x0,pcVar8 + 4,
                              extra_flags);
        pIVar5 = GImGui;
        fVar11 = (pIVar4->Style).ItemInnerSpacing.x;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->Accessed = true;
        if (pIVar3->SkipItems == false) {
          if (fVar11 < 0.0) {
            fVar11 = (pIVar5->Style).ItemSpacing.x;
          }
          (pIVar3->DC).CursorPos.x = fVar11 + (pIVar3->DC).CursorPosPrevLine.x;
          (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
          (pIVar3->DC).CurrentLineHeight = (pIVar3->DC).PrevLineHeight;
          (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
        }
        bVar7 = (bool)(bVar7 | bVar6);
        PopID();
        PopItemWidth();
        uVar9 = uVar9 + 1;
        v = v + 1;
      } while ((uint)components != uVar9);
    }
    PopID();
    fVar11 = (pIVar2->DC).CurrentLineTextBaseOffset;
    fVar1 = (pIVar4->Style).FramePadding.y;
    uVar10 = -(uint)(fVar1 <= fVar11);
    (pIVar2->DC).CurrentLineTextBaseOffset = (float)(~uVar10 & (uint)fVar1 | (uint)fVar11 & uVar10);
    pcVar8 = label;
    if (label != (char *)0xffffffffffffffff) {
      do {
        if (*pcVar8 == '#') {
          if (pcVar8[1] == '#') goto LAB_00137b95;
        }
        else if (*pcVar8 == '\0') goto LAB_00137b95;
        pcVar8 = pcVar8 + 1;
      } while (pcVar8 != (char *)0xffffffffffffffff);
      pcVar8 = (char *)0xffffffffffffffff;
    }
LAB_00137b95:
    TextUnformatted(label,pcVar8);
    EndGroup();
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ImGui::InputIntN(const char* label, int* v, int components, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= InputInt("##v", &v[i], 0, 0, extra_flags);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
    }
    PopID();

    window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.CurrentLineTextBaseOffset, g.Style.FramePadding.y);
    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}